

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O1

CURLcode multi_done(Curl_easy *data,CURLcode status,_Bool premature)

{
  undefined1 *puVar1;
  uint uVar2;
  connectdata *conn;
  Curl_done_func p_Var3;
  _Bool _Var4;
  int iVar5;
  CURLcode CVar6;
  long lVar7;
  CURLcode CVar8;
  tempbuf *ptVar9;
  ulong uVar10;
  char buffer [256];
  char local_138 [264];
  
  if (((data->state).field_0x4e5 & 8) == 0) {
    conn = data->conn;
    Curl_resolver_kill(conn);
    (*Curl_cfree)((data->req).newurl);
    (data->req).newurl = (char *)0x0;
    (*Curl_cfree)((data->req).location);
    (data->req).location = (char *)0x0;
    if ((status < CURLE_BAD_FUNCTION_ARGUMENT) &&
       ((0x40004800000U >> ((ulong)status & 0x3f) & 1) != 0)) {
      premature = true;
    }
    p_Var3 = conn->handler->done;
    if (p_Var3 != (Curl_done_func)0x0) {
      status = (*p_Var3)(conn,status,premature);
    }
    CVar8 = CURLE_ABORTED_BY_CALLBACK;
    if (status != CURLE_ABORTED_BY_CALLBACK) {
      iVar5 = Curl_pgrsDone(conn);
      CVar8 = CURLE_ABORTED_BY_CALLBACK;
      if (iVar5 == 0) {
        CVar8 = status;
      }
      if (status != CURLE_OK) {
        CVar8 = status;
      }
    }
    process_pending_handles(data->multi);
    if (data->conn != (connectdata *)0x0) {
      Curl_llist_remove(&data->conn->easyq,&data->conn_queue,(void *)0x0);
    }
    data->conn = (connectdata *)0x0;
    if ((conn->easyq).size == 0) {
      puVar1 = &(data->state).field_0x4e5;
      *puVar1 = *puVar1 | 8;
      if (conn->dns_entry != (Curl_dns_entry *)0x0) {
        Curl_resolv_unlock(data,conn->dns_entry);
        conn->dns_entry = (Curl_dns_entry *)0x0;
      }
      Curl_hostcache_prune(data);
      (*Curl_cfree)((data->state).ulbuf);
      (data->state).ulbuf = (char *)0x0;
      if ((data->state).tempcount != 0) {
        ptVar9 = (data->state).tempwrite;
        uVar10 = 0;
        do {
          (*Curl_cfree)(ptVar9->buf);
          uVar10 = uVar10 + 1;
          ptVar9 = ptVar9 + 1;
        } while (uVar10 < (data->state).tempcount);
      }
      (data->state).tempcount = 0;
      if (((((((data->set).field_0x88c & 1) == 0) || (conn->http_ntlm_state == NTLMSTATE_TYPE2)) ||
           (conn->proxy_ntlm_state == NTLMSTATE_TYPE2)) &&
          (uVar2 = *(uint *)&(conn->bits).field_0x4, (uVar2 & 1) == 0)) &&
         ((premature == false || ((conn->handler->flags & 0x200) != 0)))) {
        lVar7 = 0x128;
        if ((((uVar2 & 0x40) == 0) && (lVar7 = 0x168, (uVar2 & 0x20) == 0)) &&
           (lVar7 = 0x108, (uVar2 & 4) == 0)) {
          lVar7 = 0xd8;
        }
        curl_msnprintf(local_138,0x100,"Connection #%ld to host %s left intact",conn->connection_id,
                       *(undefined8 *)((conn->chunk).hexbuffer + lVar7 + -0x20));
        _Var4 = Curl_conncache_return_conn(conn);
        if (_Var4) {
          (data->state).lastconnect = conn;
          Curl_infof(data,"%s\n",local_138);
        }
        else {
          (data->state).lastconnect = (connectdata *)0x0;
        }
      }
      else {
        CVar6 = Curl_disconnect(data,conn,premature);
        if (CVar6 == CURLE_OK) {
          CVar6 = CVar8;
        }
        if (CVar8 == CURLE_OK) {
          CVar8 = CVar6;
        }
      }
      Curl_free_request_state(data);
      return CVar8;
    }
  }
  return CURLE_OK;
}

Assistant:

static CURLcode multi_done(struct Curl_easy *data,
                           CURLcode status,  /* an error if this is called
                                                after an error was detected */
                           bool premature)
{
  CURLcode result;
  struct connectdata *conn = data->conn;
  unsigned int i;

  DEBUGF(infof(data, "multi_done\n"));

  if(data->state.done)
    /* Stop if multi_done() has already been called */
    return CURLE_OK;

  /* Stop the resolver and free its own resources (but not dns_entry yet). */
  Curl_resolver_kill(conn);

  /* Cleanup possible redirect junk */
  Curl_safefree(data->req.newurl);
  Curl_safefree(data->req.location);

  switch(status) {
  case CURLE_ABORTED_BY_CALLBACK:
  case CURLE_READ_ERROR:
  case CURLE_WRITE_ERROR:
    /* When we're aborted due to a callback return code it basically have to
       be counted as premature as there is trouble ahead if we don't. We have
       many callbacks and protocols work differently, we could potentially do
       this more fine-grained in the future. */
    premature = TRUE;
  default:
    break;
  }

  /* this calls the protocol-specific function pointer previously set */
  if(conn->handler->done)
    result = conn->handler->done(conn, status, premature);
  else
    result = status;

  if(CURLE_ABORTED_BY_CALLBACK != result) {
    /* avoid this if we already aborted by callback to avoid this calling
       another callback */
    CURLcode rc = Curl_pgrsDone(conn);
    if(!result && rc)
      result = CURLE_ABORTED_BY_CALLBACK;
  }

  process_pending_handles(data->multi); /* connection / multiplex */

  detach_connnection(data);
  if(CONN_INUSE(conn)) {
    /* Stop if still used. */
    DEBUGF(infof(data, "Connection still in use %zu, "
                 "no more multi_done now!\n",
                 conn->easyq.size));
    return CURLE_OK;
  }

  data->state.done = TRUE; /* called just now! */

  if(conn->dns_entry) {
    Curl_resolv_unlock(data, conn->dns_entry); /* done with this */
    conn->dns_entry = NULL;
  }
  Curl_hostcache_prune(data);
  Curl_safefree(data->state.ulbuf);

  /* if the transfer was completed in a paused state there can be buffered
     data left to free */
  for(i = 0; i < data->state.tempcount; i++) {
    free(data->state.tempwrite[i].buf);
  }
  data->state.tempcount = 0;

  /* if data->set.reuse_forbid is TRUE, it means the libcurl client has
     forced us to close this connection. This is ignored for requests taking
     place in a NTLM/NEGOTIATE authentication handshake

     if conn->bits.close is TRUE, it means that the connection should be
     closed in spite of all our efforts to be nice, due to protocol
     restrictions in our or the server's end

     if premature is TRUE, it means this connection was said to be DONE before
     the entire request operation is complete and thus we can't know in what
     state it is for re-using, so we're forced to close it. In a perfect world
     we can add code that keep track of if we really must close it here or not,
     but currently we have no such detail knowledge.
  */

  if((data->set.reuse_forbid
#if defined(USE_NTLM)
      && !(conn->http_ntlm_state == NTLMSTATE_TYPE2 ||
           conn->proxy_ntlm_state == NTLMSTATE_TYPE2)
#endif
#if defined(USE_SPNEGO)
      && !(conn->http_negotiate_state == GSS_AUTHRECV ||
           conn->proxy_negotiate_state == GSS_AUTHRECV)
#endif
     ) || conn->bits.close
       || (premature && !(conn->handler->flags & PROTOPT_STREAM))) {
    CURLcode res2 = Curl_disconnect(data, conn, premature);

    /* If we had an error already, make sure we return that one. But
       if we got a new error, return that. */
    if(!result && res2)
      result = res2;
  }
  else {
    char buffer[256];
    /* create string before returning the connection */
    msnprintf(buffer, sizeof(buffer),
              "Connection #%ld to host %s left intact",
              conn->connection_id,
              conn->bits.socksproxy ? conn->socks_proxy.host.dispname :
              conn->bits.httpproxy ? conn->http_proxy.host.dispname :
              conn->bits.conn_to_host ? conn->conn_to_host.dispname :
              conn->host.dispname);

    /* the connection is no longer in use by this transfer */
    if(Curl_conncache_return_conn(conn)) {
      /* remember the most recently used connection */
      data->state.lastconnect = conn;
      infof(data, "%s\n", buffer);
    }
    else
      data->state.lastconnect = NULL;
  }

  Curl_free_request_state(data);
  return result;
}